

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O3

void __thiscall
mocker::detail::RegisterAllocator::color(RegisterAllocator *this,RegMap<Node> *coloring)

{
  Line *__args;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_int **__n;
  Section *pSVar2;
  _List_node_base *p_Var3;
  const_iterator __position;
  bool bVar4;
  bool bVar5;
  int iVar6;
  _Node *p_Var7;
  _List_node_base *p_Var8;
  iterator __position_00;
  shared_ptr<mocker::nasm::Register> src;
  list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> insts;
  shared_ptr<mocker::nasm::Mov> p;
  shared_ptr<mocker::nasm::Register> dest;
  shared_ptr<mocker::nasm::Inst> newInst;
  shared_ptr<mocker::nasm::Addr> local_d0;
  _List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> local_c0;
  long local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  RegMap<std::shared_ptr<Register>_> *pRStack_98;
  shared_ptr<mocker::nasm::Addr> local_90;
  long local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  shared_ptr<mocker::nasm::Inst> local_70;
  Line local_60;
  
  local_c0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_c0;
  local_c0._M_impl._M_node._M_size = 0;
  __position_00._M_node = (this->funcBeg)._M_node;
  p_Var8 = (this->funcEnd)._M_node;
  local_c0._M_impl._M_node.super__List_node_base._M_prev =
       local_c0._M_impl._M_node.super__List_node_base._M_next;
  pRStack_98 = coloring;
  if (p_Var8 != __position_00._M_node) {
    do {
      __args = (Line *)(__position_00._M_node + 1);
      if (__position_00._M_node[3]._M_next == (_List_node_base *)0x0) {
        p_Var7 = std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
                 _M_create_node<mocker::nasm::Line_const&>
                           ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)&local_c0
                            ,__args);
        std::__detail::_List_node_base::_M_hook(&p_Var7->super__List_node_base);
        local_c0._M_impl._M_node._M_size = local_c0._M_impl._M_node._M_size + 1;
      }
      else {
        nasm::replaceRegs((nasm *)&local_70,
                          (shared_ptr<mocker::nasm::Inst> *)(__position_00._M_node + 3),pRStack_98);
        nasm::dyc<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Inst>&>
                  ((nasm *)&local_a8,&local_70);
        if (local_a8 == 0) {
LAB_00131f8e:
          bVar5 = false;
        }
        else {
          local_d0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(element_type **)(local_a8 + 8);
          local_d0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_a8 + 0x10);
          if (local_d0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_d0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_d0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_d0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_d0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          nasm::dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>const>
                    ((nasm *)&local_80,&local_d0);
          if (local_d0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_d0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          local_90.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(element_type **)(local_a8 + 0x18);
          local_90.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_a8 + 0x20);
          if (local_90.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_90.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_90.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_90.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_90.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          nasm::dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>const>
                    ((nasm *)&local_d0,&local_90);
          if (local_90.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_90.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          bVar5 = false;
          bVar4 = true;
          if (((local_80 != 0) &&
              (local_d0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
               (element_type *)0x0)) &&
             (__n = *(_func_int ***)(local_80 + 0x10),
             __n == local_d0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr[2]._vptr_Addr)) {
            if (__n != (_func_int **)0x0) {
              iVar6 = bcmp(*(void **)(local_80 + 8),
                           local_d0.
                           super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           [1]._vptr_Addr,(size_t)__n);
              bVar5 = false;
              if (iVar6 != 0) goto LAB_00131f6b;
            }
            p_Var7 = std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
                     _M_create_node<std::__cxx11::string_const&>
                               ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)
                                &local_c0,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__args);
            std::__detail::_List_node_base::_M_hook(&p_Var7->super__List_node_base);
            local_c0._M_impl._M_node._M_size = local_c0._M_impl._M_node._M_size + 1;
            bVar5 = true;
            bVar4 = false;
          }
LAB_00131f6b:
          if (local_d0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_d0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
          }
          if (bVar4) goto LAB_00131f8e;
        }
        if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
        }
        if (!bVar5) {
          p_Var7 = std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
                   _M_create_node<std::__cxx11::string_const&,std::shared_ptr<mocker::nasm::Inst>&>
                             ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)
                              &local_c0,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __args,&local_70);
          std::__detail::_List_node_base::_M_hook(&p_Var7->super__List_node_base);
          local_c0._M_impl._M_node._M_size = local_c0._M_impl._M_node._M_size + 1;
        }
        if (local_70.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_70.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      __position_00._M_node = (__position_00._M_node)->_M_next;
      p_Var8 = (this->funcEnd)._M_node;
    } while (__position_00._M_node != p_Var8);
    __position_00._M_node = (this->funcBeg)._M_node;
  }
  if (__position_00._M_node != p_Var8) {
    pSVar2 = this->section;
    do {
      p_Var3 = (__position_00._M_node)->_M_next;
      std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::_M_erase
                (&pSVar2->lines,__position_00);
      __position_00._M_node = p_Var3;
    } while (p_Var3 != p_Var8);
  }
  (this->funcEnd)._M_node = p_Var8;
  (this->funcBeg)._M_node = p_Var8;
  p_Var8 = p_Var8->_M_prev;
  (this->funcBeg)._M_node = p_Var8;
  if (local_c0._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_c0) {
    paVar1 = &local_60.label.field_2;
    p_Var8 = local_c0._M_impl._M_node.super__List_node_base._M_next;
    do {
      pSVar2 = this->section;
      __position._M_node = (this->funcEnd)._M_node;
      p_Var3 = p_Var8 + 2;
      if (p_Var8[1]._M_next == p_Var3) {
        local_60.label.field_2._M_allocated_capacity = (size_type)p_Var3->_M_next;
        local_60.label.field_2._8_8_ = p_Var8[2]._M_prev;
        local_60.label._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_60.label.field_2._M_allocated_capacity = (size_type)p_Var3->_M_next;
        local_60.label._M_dataplus._M_p = (pointer)p_Var8[1]._M_next;
      }
      local_60.label._M_string_length = (size_type)p_Var8[1]._M_prev;
      p_Var8[1]._M_next = p_Var3;
      p_Var8[1]._M_prev = (_List_node_base *)0x0;
      *(undefined1 *)&p_Var8[2]._M_next = 0;
      local_60.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (((_List_impl *)&p_Var8[3]._M_next)->_M_node).super__List_node_base._M_next;
      local_60.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var8[3]._M_prev;
      p_Var8[3]._M_prev = (_List_node_base *)0x0;
      (((_List_impl *)&p_Var8[3]._M_next)->_M_node).super__List_node_base._M_next =
           (_List_node_base *)0x0;
      std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::
      emplace<mocker::nasm::Line>(&pSVar2->lines,__position,&local_60);
      if (local_60.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60.label._M_dataplus._M_p != paVar1) {
        operator_delete(local_60.label._M_dataplus._M_p,
                        (ulong)(local_60.label.field_2._M_allocated_capacity + 1));
      }
      p_Var8 = (((_List_impl *)&p_Var8->_M_next)->_M_node).super__List_node_base._M_next;
    } while (p_Var8 != (_List_node_base *)&local_c0);
    p_Var8 = (this->funcBeg)._M_node;
  }
  (this->funcBeg)._M_node = p_Var8->_M_next;
  std::__cxx11::_List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::_M_clear
            (&local_c0);
  return;
}

Assistant:

void RegisterAllocator::color(const RegMap<Node> &coloring) {
  std::list<nasm::Line> insts;
  for (auto iter = funcBeg; iter != funcEnd; ++iter) {
    auto &inst = iter->inst;
    if (!inst) {
      insts.emplace_back(*iter);
      continue;
    }
    auto newInst = nasm::replaceRegs(inst, coloring);
    if (auto p = nasm::dyc<nasm::Mov>(newInst)) {
      auto dest = nasm::dyc<nasm::Register>(p->getDest());
      auto src = nasm::dyc<nasm::Register>(p->getOperand());
      if (dest && src && dest->getIdentifier() == src->getIdentifier()) {
        insts.emplace_back(iter->label);
        continue;
      }
    }
    insts.emplace_back(iter->label, newInst);
  }

  funcBeg = funcEnd = section.erase(funcBeg, funcEnd);
  --funcBeg;
  for (auto &inst : insts) {
    section.appendLine(funcEnd, std::move(inst));
  }
  ++funcBeg;
}